

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

int ggwave_encode(ggwave_Instance id,void *payloadBuffer,int payloadSize,
                 ggwave_ProtocolId protocolId,int volume,void *waveformBuffer,int query)

{
  uint uVar1;
  void *__src;
  undefined4 in_ECX;
  uint in_EDX;
  uint in_EDI;
  void *in_R9;
  char *pDst;
  char *pSrc;
  int nBytes;
  GGWave *ggWave;
  GGWave *in_stack_000006a8;
  GGWave *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint32_t local_4;
  
  if (*(GGWave **)((anonymous_namespace)::g_instances + (long)(int)in_EDI * 8) == (GGWave *)0x0) {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Invalid GGWave instance %d\n",(ulong)in_EDI);
    }
    local_4 = 0xffffffff;
  }
  else {
    uVar1 = GGWave::init(*(GGWave **)((anonymous_namespace)::g_instances + (long)(int)in_EDI * 8),
                         (EVP_PKEY_CTX *)(ulong)in_EDX);
    if ((uVar1 & 1) == 0) {
      if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
        fprintf((anonymous_namespace)::g_fptr,
                "Failed to initialize Tx transmission for GGWave instance %d\n",(ulong)in_EDI);
      }
      local_4 = 0xffffffff;
    }
    else if ((int)pSrc == 0) {
      local_4 = GGWave::encode(in_stack_000006a8);
      if (local_4 == 0) {
        if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
          fprintf((anonymous_namespace)::g_fptr,"Failed to encode data - GGWave instance %d\n",
                  (ulong)in_EDI);
        }
        local_4 = 0xffffffff;
      }
      else {
        __src = GGWave::txWaveform((GGWave *)CONCAT44(local_4,in_stack_ffffffffffffffc8));
        memcpy(in_R9,__src,(long)(int)local_4);
      }
    }
    else if ((int)pSrc == 1) {
      local_4 = GGWave::encodeSize_bytes(in_stack_ffffffffffffffc0);
    }
    else {
      local_4 = GGWave::encodeSize_samples((GGWave *)CONCAT44(in_EDX,in_ECX));
    }
  }
  return local_4;
}

Assistant:

int ggwave_encode(
        ggwave_Instance id,
        const void * payloadBuffer,
        int payloadSize,
        ggwave_ProtocolId protocolId,
        int volume,
        void * waveformBuffer,
        int query) {
    GGWave * ggWave = (GGWave *) g_instances[id];

    if (ggWave == nullptr) {
        ggprintf("Invalid GGWave instance %d\n", id);
        return -1;
    }

    if (ggWave->init(payloadSize, (const char *) payloadBuffer, protocolId, volume) == false) {
        ggprintf("Failed to initialize Tx transmission for GGWave instance %d\n", id);
        return -1;
    }

    if (query != 0) {
        if (query == 1) {
            return ggWave->encodeSize_bytes();
        }

        return ggWave->encodeSize_samples();
    }

    const int nBytes = ggWave->encode();
    if (nBytes == 0) {
        ggprintf("Failed to encode data - GGWave instance %d\n", id);
        return -1;
    }

    {
        auto pSrc = (const char *) ggWave->txWaveform();
        auto pDst = (      char *) waveformBuffer;
        memcpy(pDst, pSrc, nBytes);
    }

    return nBytes;
}